

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

wchar_t lzx_make_huffman_table(huffman *hf)

{
  ushort uVar1;
  uint uVar2;
  uchar *puVar3;
  short sVar4;
  wchar_t wVar5;
  ulong uVar6;
  ulong uVar7;
  htree_t *phVar8;
  byte bVar9;
  int iVar10;
  htree_t *phVar11;
  wchar_t wVar12;
  long lVar13;
  ulong uVar14;
  uint16_t *puVar15;
  wchar_t wVar16;
  ulong uVar17;
  uint uVar18;
  wchar_t wVar19;
  uint auStack_c8 [17];
  int aiStack_84 [4];
  wchar_t local_74;
  wchar_t bitptn [17];
  
  iVar10 = 0;
  wVar5 = L'耀';
  wVar12 = L'\0';
  for (lVar13 = -0x10; lVar13 != 0; lVar13 = lVar13 + 1) {
    aiStack_84[lVar13] = iVar10;
    bitptn[lVar13 + 0xf] = wVar5;
    iVar10 = iVar10 + hf->freq[lVar13 + 0x11] * wVar5;
    if (hf->freq[lVar13 + 0x11] != L'\0') {
      wVar12 = (int)lVar13 + L'\x11';
    }
    wVar5 = (uint)wVar5 >> 1;
  }
  if ((short)iVar10 != 0) {
    return L'\0';
  }
  if (hf->tbl_bits < wVar12) {
    return L'\0';
  }
  hf->max_bits = wVar12;
  if (wVar12 < L'\x10') {
    bVar9 = 0x10 - (char)wVar12;
    uVar6 = 0;
    uVar14 = 0;
    if (L'\0' < wVar12) {
      uVar14 = (ulong)(uint)wVar12;
    }
    for (; uVar14 != uVar6; uVar6 = uVar6 + 1) {
      auStack_c8[uVar6 + 1] = (int)auStack_c8[uVar6 + 1] >> (bVar9 & 0x1f);
      bitptn[uVar6 - 1] = bitptn[uVar6 - 1] >> (bVar9 & 0x1f);
    }
    if (wVar12 < L'\v') {
      puVar15 = hf->tbl;
      wVar12 = L'\0';
      goto LAB_003e7167;
    }
  }
  wVar12 = wVar12 + L'\xfffffff6';
  for (lVar13 = 1; lVar13 != 0xb; lVar13 = lVar13 + 1) {
    auStack_c8[lVar13] = (int)auStack_c8[lVar13] >> ((byte)wVar12 & 0x1f);
    aiStack_84[lVar13 + 3] = aiStack_84[lVar13 + 3] >> ((byte)wVar12 & 0x1f);
  }
  puVar15 = hf->tbl;
  for (lVar13 = ((long)hf->freq[10] * (long)bitptn[8] + (long)(int)auStack_c8[10]) * 2;
      lVar13 < 0x800; lVar13 = lVar13 + 2) {
    *(undefined2 *)((long)puVar15 + lVar13) = 0;
  }
LAB_003e7167:
  hf->shift_bits = wVar12;
  puVar3 = hf->bitlen;
  wVar5 = hf->len_size;
  hf->tree_used = L'\0';
  wVar19 = L'\0';
  uVar6 = 0;
  if (L'\0' < wVar5) {
    uVar6 = (ulong)(uint)wVar5;
  }
  uVar14 = 0;
  do {
    if (uVar14 == uVar6) {
      return L'\x01';
    }
    bVar9 = puVar3[uVar14];
    if (bVar9 != 0) {
      uVar17 = (ulong)((uint)bVar9 * 4);
      uVar2 = *(uint *)((long)auStack_c8 + uVar17);
      uVar18 = *(uint *)((long)aiStack_84 + uVar17 + 0xc);
      uVar7 = (ulong)uVar18;
      iVar10 = uVar18 + uVar2;
      *(int *)((long)auStack_c8 + uVar17) = iVar10;
      if (bVar9 < 0xb) {
        if (0x400 < iVar10) {
          return L'\0';
        }
        for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
          puVar15[(long)(int)uVar2 + (uVar7 - 1)] = (uint16_t)uVar14;
        }
      }
      else {
        iVar10 = (int)uVar2 >> ((byte)wVar12 & 0x1f);
        sVar4 = (short)wVar5;
        if (puVar15[iVar10] == 0) {
          puVar15[iVar10] = (short)wVar19 + sVar4;
          phVar8 = hf->tree;
          wVar16 = wVar19 + L'\x01';
          hf->tree_used = wVar16;
          if (hf->tree_avail <= wVar19) {
            return L'\0';
          }
          phVar11 = phVar8 + wVar19;
          phVar11->left = 0;
          phVar11->right = 0;
        }
        else {
          wVar16 = (wchar_t)puVar15[iVar10];
          if (wVar16 < wVar5) {
            return L'\0';
          }
          if (wVar19 + wVar5 <= wVar16) {
            return L'\0';
          }
          phVar8 = hf->tree;
          phVar11 = phVar8 + (wVar16 - wVar5);
          wVar16 = wVar19;
        }
        uVar18 = 1 << ((byte)wVar12 - 1 & 0x1f);
        for (iVar10 = bVar9 - 10; 1 < iVar10; iVar10 = iVar10 + -1) {
          if ((uVar18 & 0xffff & uVar2) == 0) {
            uVar1 = phVar11->right;
            if (wVar5 <= (int)(uint)uVar1) goto LAB_003e72bc;
            phVar11->right = (short)wVar16 + sVar4;
LAB_003e72a4:
            hf->tree_used = wVar16 + L'\x01';
            if (hf->tree_avail <= wVar16) {
              return L'\0';
            }
            phVar11 = phVar8 + wVar16;
            phVar11->left = 0;
            phVar11->right = 0;
            wVar16 = wVar16 + L'\x01';
          }
          else {
            uVar1 = phVar11->left;
            if ((int)(uint)uVar1 < wVar5) {
              phVar11->left = (short)wVar16 + sVar4;
              goto LAB_003e72a4;
            }
LAB_003e72bc:
            phVar11 = phVar8 + ((ulong)uVar1 - (long)wVar5);
          }
          uVar18 = (uVar18 & 0xffff) >> 1;
        }
        if ((ushort)((ushort)uVar2 & (ushort)uVar18) == 0) {
          if (phVar11->right != 0) {
            return L'\0';
          }
          phVar11 = (htree_t *)&phVar11->right;
        }
        else if (phVar11->left != 0) {
          return L'\0';
        }
        phVar11->left = (uint16_t)uVar14;
        wVar19 = wVar16;
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

static int
lzx_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if ((ptn & 0xffff) != 0 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		int htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_size;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			while (--cnt >= 0)
				p[cnt] = (uint16_t)i;
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}